

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

_Bool al_install_system(int version,_func_int__func_void_ptr *atexit_ptr)

{
  _Bool _Var1;
  uint32_t b;
  int iVar2;
  ALLEGRO_SYSTEM *func;
  char *__s1;
  time_t tVar3;
  code *in_RSI;
  int in_EDI;
  int library_version;
  ALLEGRO_SYSTEM *real_system;
  ALLEGRO_SYSTEM bootstrap;
  undefined4 in_stack_ffffffffffffffa8;
  undefined1 local_48 [16];
  _AL_VECTOR *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffffc;
  
  b = al_get_allegro_version();
  if (active_sysdrv == (ALLEGRO_SYSTEM *)0x0) {
    _Var1 = compatible_versions(in_EDI,b);
    if (_Var1) {
      _al_tls_init_once();
      _al_reinitialize_tls_values();
      _al_vector_init(&_al_system_interfaces,8);
      memset(local_48,0,0x38);
      active_sysdrv = (ALLEGRO_SYSTEM *)local_48;
      read_allegro_cfg();
      _al_register_system_interfaces();
      func = find_system(in_stack_ffffffffffffffc8);
      if (func == (ALLEGRO_SYSTEM *)0x0) {
        func = find_system(in_stack_ffffffffffffffc8);
      }
      if (func == (ALLEGRO_SYSTEM *)0x0) {
        active_sysdrv = (ALLEGRO_SYSTEM *)0x0;
        _Var1 = false;
      }
      else {
        active_sysdrv = func;
        func->mouse_wheel_precision = 1;
        _Var1 = _al_trace_prefix((char *)real_system,library_version,
                                 (char *)CONCAT44(in_stack_fffffffffffffffc,in_EDI),
                                 (int)((ulong)in_RSI >> 0x20),in_stack_ffffffffffffffe8);
        if (_Var1) {
          _al_trace_suffix("Allegro version: %s\n","5.2.7 (GIT)");
        }
        __s1 = al_get_app_name();
        iVar2 = strcmp(__s1,"");
        if (iVar2 == 0) {
          al_set_app_name((char *)func);
        }
        _al_add_exit_func((_func_void *)func,(char *)CONCAT44(b,in_stack_ffffffffffffffa8));
        iVar2 = (int)((ulong)func >> 0x20);
        _al_dtor_list = _al_init_destructors();
        _al_init_events();
        _al_init_pixels();
        _al_init_iio_table();
        _al_init_convert_bitmap_list();
        _al_init_timers();
        _al_glsl_init_shaders();
        if (active_sysdrv->vt->heartbeat_init != (_func_void *)0x0) {
          (*active_sysdrv->vt->heartbeat_init)();
        }
        if ((in_RSI != (code *)0x0) && ((atexit_virgin & 1U) != 0)) {
          (*in_RSI)(al_uninstall_system);
          atexit_virgin = false;
        }
        al_set_errno(iVar2);
        active_sysdrv->installed = true;
        tVar3 = time((time_t *)0x0);
        _al_srand((int)tVar3);
        _Var1 = true;
      }
    }
    else {
      _Var1 = false;
    }
  }
  else {
    _Var1 = true;
  }
  return _Var1;
}

Assistant:

bool al_install_system(int version, int (*atexit_ptr)(void (*)(void)))
{
   ALLEGRO_SYSTEM bootstrap;
   ALLEGRO_SYSTEM *real_system;
   int library_version = al_get_allegro_version();

   if (active_sysdrv) {
      return true;
   }

   /* Note: We cannot call logging functions yet.
    * TODO: Maybe we want to do the check after the "bootstrap" system
    * is available at least?
    */
   if (!compatible_versions(version, library_version))
      return false;

   _al_tls_init_once();
   _al_reinitialize_tls_values();

   _al_vector_init(&_al_system_interfaces, sizeof(ALLEGRO_SYSTEM_INTERFACE *));

   /* Set up a bootstrap system so the calls expecting it don't freak out */
   memset(&bootstrap, 0, sizeof(bootstrap));
   active_sysdrv = &bootstrap;
   read_allegro_cfg();

#ifdef ALLEGRO_BCC32
   /* This supresses exceptions on floating point divide by zero */
   _control87(MCW_EM, MCW_EM);
#endif

   /* Register builtin system drivers */
   _al_register_system_interfaces();

   /* Check for a user-defined system driver first */
   real_system = find_system(&_user_system_interfaces);

   /* If a user-defined driver is not found, look for a builtin one */
   if (real_system == NULL) {
      real_system = find_system(&_al_system_interfaces);
   }

   if (real_system == NULL) {
      active_sysdrv = NULL;
      return false;
   }
   
   active_sysdrv = real_system;
   active_sysdrv->mouse_wheel_precision = 1;

   ALLEGRO_INFO("Allegro version: %s\n", ALLEGRO_VERSION_STR);

   if (strcmp(al_get_app_name(), "") == 0) {
      al_set_app_name(NULL);
   }

   _al_add_exit_func(shutdown_system_driver, "shutdown_system_driver");

   _al_dtor_list = _al_init_destructors();

   _al_init_events();

   _al_init_pixels();

   _al_init_iio_table();
   
   _al_init_convert_bitmap_list();

   _al_init_timers();

#ifdef ALLEGRO_CFG_SHADER_GLSL
   _al_glsl_init_shaders();
#endif

   if (active_sysdrv->vt->heartbeat_init)
      active_sysdrv->vt->heartbeat_init();

   if (atexit_ptr && atexit_virgin) {
#ifndef ALLEGRO_ANDROID
      atexit_ptr(al_uninstall_system);
#endif
      atexit_virgin = false;
   }

   /* Clear errnos set while searching for config files. */
   al_set_errno(0);

   active_sysdrv->installed = true;

   _al_srand(time(NULL));

   return true;
}